

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::processDisconnectCommand(CoreBroker *this,ActionMessage *command)

{
  bool bVar1;
  GlobalBrokerId GVar2;
  action_t aVar3;
  route_id rVar4;
  BasicBrokerInfo *pBVar5;
  ActionMessage *in_RSI;
  long *in_RDI;
  BasicBrokerInfo *brk;
  BasicBrokerInfo *in_stack_000000f8;
  CoreBroker *in_stack_00000100;
  ActionMessage *in_stack_00000120;
  CoreBroker *in_stack_00000128;
  BasicBrokerInfo *in_stack_000004b8;
  ActionMessage *in_stack_000004c0;
  CoreBroker *in_stack_000004c8;
  GlobalFederateId *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  GlobalFederateId id;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  GlobalBrokerId brokerid;
  
  brokerid.gid = (BaseType)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  GVar2 = GlobalFederateId::operator_cast_to_GlobalBrokerId(in_stack_ffffffffffffffb8);
  pBVar5 = getBrokerById((CoreBroker *)CONCAT44(GVar2.gid,in_stack_ffffffffffffffe0),brokerid);
  aVar3 = ActionMessage::action(in_RSI);
  if ((aVar3 == cmd_priority_disconnect) || (aVar3 == cmd_disconnect)) {
    GVar2.gid = *(BaseType *)((long)in_RDI + 0x14);
    bVar1 = GlobalFederateId::operator==(&in_RSI->dest_id,GVar2);
    if (bVar1) {
      disconnectTiming((CoreBroker *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (ActionMessage *)CONCAT44(in_stack_ffffffffffffffcc,aVar3));
    }
    else {
      uVar6 = 0;
      bVar1 = GlobalFederateId::operator==(&in_RSI->dest_id,(GlobalBrokerId)0x0);
      if (bVar1) {
        processBrokerDisconnect(in_stack_000004c8,in_stack_000004c0,in_stack_000004b8);
      }
      else {
        id.gid = *(BaseType *)((long)in_RDI + 0xdbc);
        bVar1 = GlobalFederateId::operator==(&in_RSI->dest_id,id);
        if (bVar1) {
          processTimeMonitorMessage(in_stack_00000128,in_stack_00000120);
        }
        else {
          rVar4 = getRoute((CoreBroker *)CONCAT44(uVar6,id.gid),(GlobalFederateId)GVar2.gid);
          (**(code **)(*in_RDI + 0x110))(in_RDI,rVar4.rid,in_RSI);
        }
      }
    }
  }
  else if ((((uint)(aVar3 + (cmd_route_ack|cmd_disconnect_core)) < 2) &&
           (pBVar5 != (BasicBrokerInfo *)0x0)) &&
          (disconnectBroker(in_stack_00000100,in_stack_000000f8),
          (*(byte *)((long)in_RDI + 0x29c) & 1) == 0)) {
    (**(code **)(*in_RDI + 0x110))(in_RDI,0,in_RSI);
  }
  return;
}

Assistant:

void CoreBroker::processDisconnectCommand(ActionMessage& command)
{
    auto* brk = getBrokerById(GlobalBrokerId{command.source_id});
    switch (command.action()) {
        case CMD_DISCONNECT:
        case CMD_PRIORITY_DISCONNECT:
            if (command.dest_id == global_broker_id_local) {
                // deal with the time implications of the message
                disconnectTiming(command);
            } else if (command.dest_id == parent_broker_id) {
                processBrokerDisconnect(command, brk);
            } else if (command.dest_id == mTimeMonitorLocalFederateId) {
                processTimeMonitorMessage(command);
            } else {
                transmit(getRoute(command.dest_id), command);
            }
            break;
        case CMD_DISCONNECT_CORE:
        case CMD_DISCONNECT_BROKER:
            if (brk != nullptr) {
                disconnectBroker(*brk);
                if (!isRootc) {
                    transmit(parent_route_id, command);
                }
            }
            break;
        default:
            break;
    }
}